

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Alloc_hider __nptr;
  char cVar1;
  uint uVar2;
  uint *cell;
  long lVar3;
  _List *p_Var4;
  path *ppVar5;
  int *piVar6;
  ulong uVar7;
  istream *piVar8;
  _Bit_type *p_Var9;
  ostream *poVar10;
  long *plVar11;
  basic_ostream<char,_std::char_traits<char>_> *pbVar12;
  undefined8 uVar13;
  int iVar14;
  uint uVar15;
  uint num_cells;
  uint num_nets;
  Net cur_net;
  Hypergraph hypergraph;
  string cur_str;
  path input_path;
  path output_path;
  ifstream input;
  ofstream output;
  uint local_534;
  allocator_type local_52d;
  uint local_52c;
  undefined1 local_528 [16];
  _Bit_type *local_518;
  _Bit_pointer local_508;
  ulong local_500;
  Hypergraph local_4f8;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  path local_4a8;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_480;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_470;
  path local_460;
  path local_438 [13];
  undefined1 local_230 [120];
  ios_base local_1b8 [128];
  ios_base local_138 [264];
  
  if (argc - 4U < 0xfffffffe) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Usage: ./partioner [path to *.hgr file] [optional max difference]",0x41);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    return 1;
  }
  ppVar5 = &local_4a8;
  std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
            (ppVar5,argv + 1,auto_format);
  std::filesystem::current_path_abi_cxx11_();
  if (local_4a8._M_pathname._M_string_length == 0) {
LAB_0010271a:
    std::filesystem::__cxx11::path::path((path *)local_230);
  }
  else {
    uVar15 = local_4a8._32_4_;
    if ((~local_4a8._M_cmpts & 3) != 0) {
      if (((local_4a8._32_8_ & 3) == 0) &&
         (local_4a8._M_pathname._M_dataplus._M_p[local_4a8._M_pathname._M_string_length - 1] != '/')
         ) {
        if ((local_4a8._32_8_ & 3) == 0) {
          lVar3 = std::filesystem::__cxx11::path::_List::end();
          ppVar5 = (path *)(lVar3 + -0x30);
          p_Var4 = (_List *)(lVar3 + -0x10);
          if ((local_4a8._32_8_ & 3) != 0) {
            p_Var4 = &local_4a8._M_cmpts;
            ppVar5 = &local_4a8;
          }
          uVar15 = (uint)*(undefined8 *)p_Var4;
        }
        else {
          ppVar5 = &local_4a8;
        }
        if ((~uVar15 & 3) == 0) goto LAB_00102708;
      }
      goto LAB_0010271a;
    }
LAB_00102708:
    std::filesystem::__cxx11::path::path((path *)local_230,ppVar5);
  }
  std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
            ((path *)&local_4f8,(char (*) [8])".part.2",auto_format);
  ppVar5 = (path *)std::filesystem::__cxx11::path::replace_extension((path *)local_230);
  std::filesystem::__cxx11::operator/(&local_460,local_438,ppVar5);
  std::filesystem::__cxx11::path::~path((path *)&local_4f8);
  std::filesystem::__cxx11::path::~path((path *)local_230);
  std::filesystem::__cxx11::path::~path(local_438);
  local_500 = 1;
  if (argc != 3) goto LAB_00102838;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_438,argv[2],(allocator<char> *)&local_4f8);
  __nptr._M_p = local_438[0]._M_pathname._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar14 = *piVar6;
  *piVar6 = 0;
  uVar7 = strtoul(__nptr._M_p,(char **)local_230,10);
  if ((pointer)local_230._0_8_ == __nptr._M_p) {
    uVar13 = std::__throw_invalid_argument("stoul");
    std::filesystem::__cxx11::path::~path(local_438);
    std::filesystem::__cxx11::path::~path(&local_4a8);
    _Unwind_Resume(uVar13);
  }
  if (*piVar6 == 0) {
LAB_00102808:
    *piVar6 = iVar14;
  }
  else if (*piVar6 == 0x22) {
    std::__throw_out_of_range("stoul");
    goto LAB_00102808;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_pathname._M_dataplus._M_p != &local_438[0]._M_pathname.field_2) {
    operator_delete(local_438[0]._M_pathname._M_dataplus._M_p,
                    local_438[0]._M_pathname.field_2._M_allocated_capacity + 1);
  }
  local_500 = (ulong)((int)uVar7 + (uint)((int)uVar7 == 0));
LAB_00102838:
  std::ifstream::ifstream(local_438,local_4a8._M_pathname._M_dataplus._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Can not open ",0xd);
    pbVar12 = std::filesystem::__cxx11::operator<<
                        ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_4a8);
    std::ios::widen((char)*(undefined8 *)(*(long *)pbVar12 + -0x18) + (char)pbVar12);
    std::ostream::put((char)pbVar12);
    iVar14 = 1;
    std::ostream::flush();
  }
  else {
    piVar8 = std::istream::_M_extract<unsigned_int>((uint *)local_438);
    std::istream::_M_extract<unsigned_int>((uint *)piVar8);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::vector(&local_4f8.cells_,(ulong)local_534,(allocator_type *)local_230);
    local_4f8.nets_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.nets_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4f8.nets_.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4c8 = &local_4b8;
    local_4c0 = 0;
    local_4b8 = 0;
    cVar1 = std::ios::widen((char)local_438 +
                            (char)*(undefined8 *)(local_438[0]._M_pathname._M_dataplus._M_p + -0x18)
                           );
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_438,(string *)&local_4c8,cVar1);
    if (local_52c != 0) {
      uVar15 = 0;
      do {
        cVar1 = std::ios::widen((char)*(undefined8 *)
                                       (local_438[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                (char)local_438);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_438,(string *)&local_4c8,cVar1);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_230,(string *)&local_4c8,_S_in);
        local_470._M_ok = true;
        local_470._M_stream = (istream_type *)local_230;
        std::istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long>::_M_read(&local_470)
        ;
        local_480._M_stream = (istream_type *)0x0;
        local_480._M_value = 0;
        local_480._M_ok = false;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<std::istream_iterator<unsigned_int,char,std::char_traits<char>,long>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_528,&local_470,
                   &local_480,&local_52d);
        for (p_Var9 = (_Bit_type *)local_528._0_8_; p_Var9 != (_Bit_type *)local_528._8_8_;
            p_Var9 = (_Bit_type *)((long)p_Var9 + 4)) {
          *(int *)p_Var9 = (int)*p_Var9 + -1;
        }
        Hypergraph::addNet(&local_4f8,(Net *)local_528);
        if ((_Bit_type *)local_528._0_8_ != (_Bit_type *)0x0) {
          operator_delete((void *)local_528._0_8_,(long)local_518 - local_528._0_8_);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_230);
        std::ios_base::~ios_base(local_1b8);
        uVar15 = uVar15 + 1;
      } while (uVar15 < local_52c);
    }
    std::ifstream::close();
    Partitionment::Partitionment((Partitionment *)local_528,local_534);
    uVar15 = Partitionment::getPartitionCost((Partitionment *)local_528,&local_4f8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Initial cut cost: ",0x12);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    while (uVar2 = FM_pass(&local_4f8,(Partitionment *)local_528,(uint)local_500), uVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cut cost after pass #",0x15);
      *(undefined8 *)(std::ofstream::close + *(long *)(std::cout + -0x18)) = 2;
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": ",2);
      uVar15 = uVar15 - uVar2;
      *(undefined8 *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x10) = 5;
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      uVar2 = Partitionment::getPartitionCost((Partitionment *)local_528,&local_4f8);
      if (uVar15 != uVar2) {
        __assert_fail("cost == partitionment.getPartitionCost(hypergraph)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]hypergraph-partitioning/main.cpp"
                      ,0x33,"int main(int, char **)");
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Final cut cost: ",0x10);
    Partitionment::getPartitionCost((Partitionment *)local_528,&local_4f8);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    std::ofstream::ofstream(local_230,local_460._M_pathname._M_dataplus._M_p,_S_out);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Can not open ",0xd);
      pbVar12 = std::filesystem::__cxx11::operator<<
                          ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_460);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar12 + -0x18) + (char)pbVar12);
      std::ostream::put((char)pbVar12);
      iVar14 = 1;
      std::ostream::flush();
    }
    else {
      if (local_534 != 0) {
        uVar7 = 0;
        do {
          plVar11 = (long *)std::ostream::operator<<
                                      ((ostream *)local_230,
                                       (uint)((*(ulong *)(local_528._0_8_ + (uVar7 >> 6) * 8) >>
                                               (uVar7 & 0x3f) & 1) != 0));
          std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
          std::ostream::put((char)plVar11);
          std::ostream::flush();
          uVar15 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar15;
        } while (uVar15 < local_534);
      }
      iVar14 = 0;
      std::ofstream::close();
    }
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _memcpy;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
    if ((_Bit_type *)local_528._0_8_ != (_Bit_type *)0x0) {
      operator_delete((void *)local_528._0_8_,(long)local_508 - local_528._0_8_);
    }
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_4f8.nets_);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector(&local_4f8.cells_);
  }
  std::ifstream::~ifstream(local_438);
  std::filesystem::__cxx11::path::~path(&local_460);
  std::filesystem::__cxx11::path::~path(&local_4a8);
  return iVar14;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2 && argc != 3) {
    std::cout << "Usage: ./partioner [path to *.hgr file] [optional max difference]" << std::endl;
    return 1;
  }
  std::filesystem::path input_path = argv[1],
                        output_path = std::filesystem::current_path() /
                                      input_path.filename().replace_extension(".part.2");
  unsigned max_diff = 1;
  if (argc == 3)
    if (unsigned n = std::stoul(argv[2]))
      max_diff = n;
  // Load hypergraph
  std::ifstream input(input_path.c_str());
  if (!input.is_open()) {
    std::cout << "Can not open " << input_path << std::endl;
    return 1;
  }
  unsigned num_nets, num_cells;
  input >> num_nets >> num_cells;
  Hypergraph hypergraph(num_cells);
  std::string cur_str;
  std::getline(input, cur_str);
  for (unsigned i = 0; i < num_nets; ++i) {
    std::getline(input, cur_str);
    std::istringstream cur_str_buf(cur_str);
    Net cur_net{std::istream_iterator<unsigned>(cur_str_buf), std::istream_iterator<unsigned>()};
    for (unsigned &cell : cur_net)
      --cell;
    hypergraph.addNet(cur_net);
  }
  input.close();
  // Do partioning
  Partitionment partitionment(num_cells);
  unsigned cost = partitionment.getPartitionCost(hypergraph), pass_num = 0;
  std::cout << "Initial cut cost: " << cost << std::endl;
  while (auto cost_reduction = FM_pass(hypergraph, partitionment, max_diff)) {
    cost -= cost_reduction;
    ++pass_num;
    std::cout << "Cut cost after pass #" << std::setw(2) << pass_num << ": " << std::setw(5) << cost
              << std::endl;
    assert(cost == partitionment.getPartitionCost(hypergraph));
  }
  std::cout << "Final cut cost: " << partitionment.getPartitionCost(hypergraph) << std::endl;
  // Save results
  std::ofstream output(output_path.c_str());
  if (!output.is_open()) {
    std::cout << "Can not open " << output_path << std::endl;
    return 1;
  }
  for (unsigned i = 0; i < num_cells; ++i)
    output << +partitionment[i] << std::endl;
  output.close();
  return 0;
}